

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O3

char * __thiscall
CVmRuntimeSymbols::find_val_name(CVmRuntimeSymbols *this,vm_val_t *val,size_t *name_len)

{
  int iVar1;
  
  do {
    this = (CVmRuntimeSymbols *)((vm_runtime_sym *)this)->nxt;
    if ((vm_runtime_sym *)this == (vm_runtime_sym *)0x0) {
      *name_len = 0;
      return (char *)0x0;
    }
    iVar1 = vm_val_t::equals(val,&((vm_runtime_sym *)this)->val,0);
  } while (iVar1 == 0);
  *name_len = ((vm_runtime_sym *)this)->len;
  return ((vm_runtime_sym *)this)->sym;
}

Assistant:

const char *CVmRuntimeSymbols::find_val_name(VMG_ const vm_val_t *val,
                                             size_t *name_len) const
{
    vm_runtime_sym *sym;

    /* search the table */
    for (sym = head_ ; sym != 0 ; sym = sym->nxt)
    {
        /* check for a match to the value */
        if (val->equals(vmg_ &sym->val))
        {
            /* it's a match - return the name */
            *name_len = sym->len;
            return sym->sym;
        }
    }

    /* didn't find it - return null */
    *name_len = 0;
    return 0;
}